

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  long *plVar1;
  Curl_easy *data;
  http_connect_state *phVar2;
  uint uVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode CVar6;
  int iVar7;
  CHUNKcode CVar8;
  http_connect_state *phVar9;
  char *pcVar10;
  timediff_t tVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  size_t size;
  long lVar15;
  CURLcode CVar16;
  char *pcVar17;
  char *pcVar18;
  char cVar19;
  bool bVar20;
  Curl_send_buffer *req_buffer;
  undefined8 local_98;
  int *local_90;
  int local_84;
  http_connect_state *local_80;
  uint local_74;
  curl_off_t *local_70;
  curl_socket_t local_68;
  int subversion;
  long local_60;
  char *local_58;
  char *local_50;
  long *local_48;
  int *local_40;
  ssize_t local_38;
  
  local_84 = sockindex;
  local_58 = hostname;
  if (conn->connect_state == (http_connect_state *)0x0) {
    phVar9 = (http_connect_state *)(*Curl_ccalloc)(1,0x4030);
    if (phVar9 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar9;
    phVar9->tunnel_state = TUNNEL_INIT;
    phVar9->keepon = 1;
    phVar9->line_start = (char *)phVar9;
    phVar9->ptr = (char *)phVar9;
    phVar9->cl = 0;
    phVar9->close_connection = false;
  }
  subversion = 0;
  phVar9 = conn->connect_state;
  CVar6 = CURLE_OK;
  local_74 = remote_port;
  if ((phVar9 != (http_connect_state *)0x0) && (phVar9->tunnel_state != TUNNEL_COMPLETE)) {
    data = conn->data;
    local_60 = (long)local_84;
    local_68 = conn->sock[local_60];
    (conn->bits).proxy_connect_closed = false;
    local_48 = &(data->info).request_size;
    local_40 = &phVar9->perline;
    local_90 = &(data->req).httpcode;
    local_70 = &phVar9->cl;
    local_80 = phVar9;
    CVar16 = CURLE_OK;
    do {
      pcVar13 = local_58;
      uVar3 = local_74;
      if (phVar9->tunnel_state == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",local_58,(ulong)local_74);
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        req_buffer = Curl_add_buffer_init();
        CVar6 = CURLE_OUT_OF_MEMORY;
        if (req_buffer == (Curl_send_buffer *)0x0) {
LAB_00138db7:
          bVar20 = false;
          phVar9 = local_80;
        }
        else {
          pcVar13 = curl_maprintf("%s:%d",pcVar13,(ulong)uVar3);
          if (pcVar13 == (char *)0x0) {
            Curl_add_buffer_free(&req_buffer);
            goto LAB_00138db7;
          }
          CVar5 = Curl_http_output_auth(conn,"CONNECT",pcVar13,true);
          (*Curl_cfree)(pcVar13);
          pcVar13 = local_58;
          phVar9 = local_80;
          CVar6 = CVar16;
          if (CVar5 == CURLE_OK) {
            pcVar17 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar17 = "1.0";
            }
            if ((conn->host).name == local_58) {
              cVar19 = (conn->bits).ipv6_ip;
            }
            else {
              pcVar10 = strchr(local_58,0x3a);
              cVar19 = pcVar10 != (char *)0x0;
            }
            pcVar10 = "";
            if (cVar19 != '\0') {
              pcVar10 = "[";
            }
            pcVar14 = "";
            if (cVar19 != '\0') {
              pcVar14 = "]";
            }
            pcVar13 = curl_maprintf("%s%s%s:%d",pcVar10,pcVar13,pcVar14,(ulong)local_74);
            if (pcVar13 == (char *)0x0) {
              Curl_add_buffer_free(&req_buffer);
              CVar6 = CURLE_OUT_OF_MEMORY;
              bVar20 = false;
              CVar5 = CURLE_OK;
              phVar9 = local_80;
            }
            else {
              pcVar10 = Curl_checkProxyheaders(conn,"Host");
              local_98 = pcVar13;
              if (pcVar10 == (char *)0x0) {
                pcVar13 = curl_maprintf("Host: %s\r\n");
                phVar9 = local_80;
                if (pcVar13 == (char *)0x0) {
                  (*Curl_cfree)(local_98);
                  Curl_add_buffer_free(&req_buffer);
                  CVar6 = CURLE_OUT_OF_MEMORY;
                  bVar20 = false;
                  CVar5 = CURLE_OK;
                  goto LAB_00138fff;
                }
              }
              else {
                pcVar13 = (char *)0x0;
              }
              phVar9 = local_80;
              local_50 = pcVar17;
              pcVar17 = Curl_checkProxyheaders(conn,"Proxy-Connection");
              pcVar10 = "";
              if (pcVar17 == (char *)0x0) {
                pcVar10 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar14 = Curl_checkProxyheaders(conn,"User-Agent");
              pcVar17 = "";
              if ((pcVar14 == (char *)0x0) && (pcVar17 = "", (data->set).str[0x26] != (char *)0x0))
              {
                pcVar17 = (conn->allocptr).uagent;
              }
              pcVar14 = pcVar13;
              if (pcVar13 == (char *)0x0) {
                pcVar14 = "";
              }
              pcVar18 = (conn->allocptr).proxyuserpwd;
              if (pcVar18 == (char *)0x0) {
                pcVar18 = "";
              }
              CVar5 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",local_98,
                                       local_50,pcVar14,pcVar18,pcVar17,pcVar10);
              if (pcVar13 != (char *)0x0) {
                (*Curl_cfree)(pcVar13);
              }
              (*Curl_cfree)(local_98);
              if (CVar5 == CURLE_OK) {
                CVar5 = Curl_add_custom_headers(conn,true,req_buffer);
              }
              if (CVar5 == CURLE_OK) {
                CVar5 = Curl_add_bufferf(&req_buffer,"\r\n");
              }
              if (CVar5 == CURLE_OK) {
                CVar5 = Curl_add_buffer_send(&req_buffer,conn,local_48,0,local_84);
              }
              req_buffer = (Curl_send_buffer *)0x0;
              bVar20 = true;
              if (CVar5 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
            }
LAB_00138fff:
            if (bVar20) goto LAB_00139003;
            bVar20 = false;
          }
          else {
LAB_00139003:
            Curl_add_buffer_free(&req_buffer);
            if (CVar5 == CURLE_OK) {
              phVar9->tunnel_state = TUNNEL_CONNECT;
              phVar9->perline = 0;
              bVar20 = true;
            }
            else {
              bVar20 = false;
              CVar6 = CVar5;
            }
          }
        }
        iVar7 = 1;
        CVar16 = CVar6;
        if (bVar20) goto LAB_0013904c;
      }
      else {
LAB_0013904c:
        tVar11 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar11 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          CVar6 = CURLE_OPERATION_TIMEDOUT;
        }
        else {
          _Var4 = Curl_conn_data_pending(conn,local_84);
          if (_Var4) {
            iVar7 = phVar9->keepon;
            while (bVar20 = false, iVar7 != 0) {
              if (local_40 <= phVar9->ptr) {
                Curl_failf(data,"CONNECT response too large!");
                CVar6 = CURLE_RECV_ERROR;
                goto LAB_001397fc;
              }
              local_98._4_4_ = (undefined4)((ulong)local_98 >> 0x20);
              local_98 = (char *)CONCAT44(local_98._4_4_,CVar16);
              CVar6 = Curl_read(conn,local_68,phVar9->ptr,1,(ssize_t *)&req_buffer);
              lVar15 = 1;
              if ((CVar6 == CURLE_AGAIN) || (iVar7 = Curl_pgrsUpdate(conn), iVar7 != 0))
              goto LAB_001390e1;
              CVar16 = (CURLcode)local_98;
              if (CVar6 != CURLE_OK) {
                phVar9->keepon = 0;
                bVar20 = false;
                break;
              }
              bVar20 = false;
              if ((long)req_buffer < 1) {
                if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  bVar20 = true;
                  phVar9->keepon = 0;
                }
                else {
                  (conn->bits).proxy_connect_closed = true;
                  Curl_infof(data,"Proxy CONNECT connection closed\n");
                  phVar9->keepon = 0;
                }
                break;
              }
              if (phVar9->keepon < 2) {
                size = (long)phVar9->perline + 1;
                phVar9->perline = (int)size;
                if (*phVar9->ptr == '\n') {
                  if ((data->set).verbose == true) {
                    Curl_debug(data,CURLINFO_HEADER_IN,phVar9->line_start,size);
                  }
                  if (((data->set).suppress_connect_headers == false) &&
                     (CVar6 = Curl_client_write(conn,(data->set).include_header | 2,
                                                phVar9->line_start,(long)phVar9->perline),
                     CVar6 != CURLE_OK)) goto LAB_001390e1;
                  lVar12 = (long)phVar9->perline;
                  plVar1 = &(data->info).header_size;
                  *plVar1 = *plVar1 + lVar12;
                  plVar1 = &(data->req).headerbytecount;
                  *plVar1 = *plVar1 + lVar12;
                  cVar19 = *phVar9->line_start;
                  if ((cVar19 != '\r') && (cVar19 != '\n')) {
                    phVar9->line_start[lVar12] = '\0';
                    iVar7 = curl_strnequal("WWW-Authenticate:",phVar9->line_start,0x11);
                    if (((iVar7 == 0) || (*local_90 != 0x191)) &&
                       ((iVar7 = curl_strnequal("Proxy-authenticate:",phVar9->line_start,0x13),
                        iVar7 == 0 || (*local_90 != 0x197)))) {
                      iVar7 = curl_strnequal("Content-Length:",phVar9->line_start,0xf);
                      if (iVar7 == 0) {
                        _Var4 = Curl_compareheader(phVar9->line_start,"Connection:","close");
                        if (_Var4) {
LAB_001395fd:
                          phVar9->close_connection = true;
                        }
                        else {
                          iVar7 = curl_strnequal("Transfer-Encoding:",phVar9->line_start,0x12);
                          if (iVar7 == 0) {
                            _Var4 = Curl_compareheader(phVar9->line_start,"Proxy-Connection:",
                                                       "close");
                            if (_Var4) goto LAB_001395fd;
                            iVar7 = __isoc99_sscanf(phVar9->line_start,"HTTP/1.%d %d",&subversion,
                                                    local_90);
                            if (iVar7 == 2) {
                              (data->info).httpproxycode = (data->req).httpcode;
                            }
                          }
                          else {
                            if (*local_90 - 200U < 100) {
                              pcVar13 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                              goto LAB_0013952f;
                            }
                            _Var4 = Curl_compareheader(phVar9->line_start,"Transfer-Encoding:",
                                                       "chunked");
                            if (_Var4) {
                              Curl_infof(data,"CONNECT responded chunked\n");
                              phVar9->chunked_encoding = true;
                              Curl_httpchunk_init(conn);
                            }
                          }
                        }
                      }
                      else if (*local_90 - 200U < 100) {
                        pcVar13 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_0013952f:
                        Curl_infof(data,pcVar13);
                      }
                      else {
                        curlx_strtoofft(phVar9->line_start + 0xf,(char **)0x0,10,local_70);
                      }
                    }
                    else {
                      local_98 = (char *)CONCAT44(local_98._4_4_,*local_90);
                      pcVar13 = Curl_copy_header_value(phVar9->line_start);
                      if (pcVar13 == (char *)0x0) {
                        bVar20 = false;
                      }
                      else {
                        CVar6 = Curl_http_input_auth(conn,(CURLcode)local_98 == 0x197,pcVar13);
                        local_98 = (char *)CONCAT44(local_98._4_4_,CVar6);
                        (*Curl_cfree)(pcVar13);
                        bVar20 = (CURLcode)local_98 == 0;
                      }
                      if (!bVar20) goto LAB_001390e1;
                    }
                    phVar9->perline = 0;
                    phVar9->ptr = phVar9->connect_buffer;
                    phVar9->line_start = phVar9->connect_buffer;
                    lVar15 = 0;
                    goto LAB_001390e1;
                  }
                  phVar9->ptr = phVar9->connect_buffer;
                  if ((*local_90 == 0x197) && ((data->state).authproblem == false)) {
                    phVar9->keepon = 2;
                    if (phVar9->cl == 0) {
                      if (phVar9->chunked_encoding != true) goto LAB_0013930e;
                      Curl_infof(data,"Ignore chunked response-body\n");
                      (data->req).ignorebody = true;
                      if (phVar9->line_start[1] == '\n') {
                        phVar9->line_start = phVar9->line_start + 1;
                      }
                      CVar8 = Curl_httpchunk_read(conn,phVar9->line_start + 1,1,
                                                  (ssize_t *)&req_buffer);
                      if (CVar8 == CHUNKE_STOP) {
                        Curl_infof(data,"chunk reading DONE\n");
                        phVar9->keepon = 0;
                        phVar9->tunnel_state = TUNNEL_COMPLETE;
                      }
                    }
                    else {
                      Curl_infof(data,"Ignore %ld bytes of response-body\n");
                    }
                  }
                  else {
LAB_0013930e:
                    phVar9->keepon = 0;
                  }
                  lVar15 = 4;
                  if (*local_70 != 0) {
LAB_001390e1:
                    CVar6 = (*(code *)(&DAT_001580b4 + *(int *)(&DAT_001580b4 + lVar15 * 4)))();
                    return CVar6;
                  }
                  phVar9->tunnel_state = TUNNEL_COMPLETE;
                }
                else {
                  phVar9->ptr = phVar9->ptr + 1;
                }
              }
              else {
                phVar9->ptr = phVar9->connect_buffer;
                lVar12 = phVar9->cl;
                if (lVar12 != 0) {
                  *local_70 = lVar12 + -1;
                  lVar15 = 4;
                  if (1 < lVar12) goto LAB_001390e1;
                  phVar9->keepon = 0;
                  phVar9->tunnel_state = TUNNEL_COMPLETE;
                  break;
                }
                local_38 = 0;
                CVar8 = Curl_httpchunk_read(conn,phVar9->connect_buffer,1,&local_38);
                if (CVar8 == CHUNKE_STOP) {
                  Curl_infof(data,"chunk reading DONE\n");
                  phVar9->keepon = 0;
                  phVar9->tunnel_state = TUNNEL_COMPLETE;
                }
              }
              iVar7 = phVar9->keepon;
            }
            iVar7 = Curl_pgrsUpdate(conn);
            CVar6 = CURLE_RECV_ERROR;
            if (iVar7 != 0) {
              CVar6 = CURLE_ABORTED_BY_CALLBACK;
            }
            if (iVar7 != 0 || bVar20) {
LAB_001397fc:
              iVar7 = 1;
            }
            else {
              if (99 < (data->info).httpproxycode - 200U) {
                CVar6 = Curl_http_auth_act(conn);
                iVar7 = 1;
                if (CVar6 != CURLE_OK) goto LAB_00139800;
                if ((conn->bits).close == true) {
                  phVar9->close_connection = true;
                }
              }
              lVar15 = local_60;
              iVar7 = 0;
              CVar6 = CVar16;
              if ((phVar9->close_connection == true) &&
                 (iVar7 = 0, (data->req).newurl != (char *)0x0)) {
                Curl_closesocket(conn,conn->sock[local_60]);
                conn->sock[lVar15] = -1;
                iVar7 = 2;
              }
            }
LAB_00139800:
            if (iVar7 == 0) {
              iVar7 = 0;
              if (((data->req).newurl != (char *)0x0) &&
                 (iVar7 = 0, phVar9->tunnel_state == TUNNEL_COMPLETE)) {
                phVar2 = conn->connect_state;
                phVar2->tunnel_state = TUNNEL_INIT;
                phVar2->keepon = 1;
                phVar2->line_start = phVar2->connect_buffer;
                phVar2->ptr = phVar2->connect_buffer;
                phVar2->cl = 0;
                phVar2->close_connection = false;
              }
            }
            goto LAB_00139804;
          }
          CVar6 = CURLE_OK;
        }
        iVar7 = 1;
      }
LAB_00139804:
      if (iVar7 != 0) {
        if (iVar7 != 2) goto LAB_001399b2;
        break;
      }
      CVar16 = CVar6;
    } while ((data->req).newurl != (char *)0x0);
    if ((data->info).httpproxycode - 200U < 100) {
      phVar9->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      CVar6 = CURLE_OK;
      Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(data->info).httpproxycode);
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
    }
    else {
      if ((phVar9->close_connection == true) && ((data->req).newurl != (char *)0x0)) {
        (conn->bits).proxy_connect_closed = true;
        Curl_infof(data,"Connect me again please\n");
        conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
        Curl_infof(conn->data,"CONNECT phase completed!\n");
      }
      else {
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar15 = local_60;
        Curl_closesocket(conn,conn->sock[local_60]);
        conn->sock[lVar15] = -1;
      }
      phVar9->tunnel_state = TUNNEL_INIT;
      CVar6 = CURLE_OK;
      if ((conn->bits).proxy_connect_closed == false) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
        CVar6 = CURLE_RECV_ERROR;
      }
    }
  }
LAB_001399b2:
  if (((CVar6 != CURLE_OK) || (conn->connect_state == (http_connect_state *)0x0)) ||
     (conn->connect_state->tunnel_state == TUNNEL_COMPLETE)) {
    conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
    Curl_infof(conn->data,"CONNECT phase completed!\n");
  }
  return CVar6;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}